

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O0

void initialize_F(void)

{
  int state;
  int iVar1;
  shifts *psVar2;
  int iVar3;
  Yshort **relation;
  char *__ptr;
  Yshort *pYVar4;
  int nwords;
  int symbol;
  int stateno;
  int nedges;
  Yshort **reads;
  Yshort *rp;
  uint *rowp;
  Yshort *edge;
  shifts *sp;
  int local_10;
  int k;
  int j;
  int i;
  
  F = (uint *)allocate(ngotos * tokensetsize * 4);
  relation = (Yshort **)allocate(ngotos << 3);
  __ptr = allocate((ngotos + 1) * 4);
  symbol = 0;
  rp = (Yshort *)F;
  for (k = 0; k < ngotos; k = k + 1) {
    state = to_state[k];
    psVar2 = shift_table[state];
    if (psVar2 != (shifts *)0x0) {
      iVar1 = psVar2->nshifts;
      local_10 = 0;
      while ((local_10 < iVar1 &&
             (iVar3 = accessing_symbol[psVar2->shift[local_10]], iVar3 < start_symbol))) {
        rp[iVar3 >> 5] = 1 << ((byte)iVar3 & 0x1f) | rp[iVar3 >> 5];
        local_10 = local_10 + 1;
      }
      for (; local_10 < iVar1; local_10 = local_10 + 1) {
        if (nullable[accessing_symbol[psVar2->shift[local_10]]] != '\0') {
          iVar3 = map_goto(state,accessing_symbol[psVar2->shift[local_10]]);
          *(int *)(__ptr + (long)symbol * 4) = iVar3;
          symbol = symbol + 1;
        }
      }
      if (symbol != 0) {
        pYVar4 = (Yshort *)allocate((symbol + 1) * 4);
        relation[k] = pYVar4;
        for (local_10 = 0; local_10 < symbol; local_10 = local_10 + 1) {
          pYVar4[local_10] = *(Yshort *)(__ptr + (long)local_10 * 4);
        }
        pYVar4[symbol] = -1;
        symbol = 0;
      }
    }
    rp = rp + tokensetsize;
  }
  *F = *F | 1;
  digraph(relation);
  for (k = 0; k < ngotos; k = k + 1) {
    if (relation[k] != (Yshort *)0x0) {
      free(relation[k]);
    }
  }
  free(relation);
  free(__ptr);
  return;
}

Assistant:

void initialize_F()
{
  register int i;
  register int j;
  register int k;
  register shifts *sp;
  register Yshort *edge;
  register unsigned *rowp;
  register Yshort *rp;
  register Yshort **reads;
  register int nedges;
  register int stateno;
  register int symbol;
  register int nwords;

  nwords = ngotos * tokensetsize;
  F = NEW2(nwords, unsigned);

  reads = NEW2(ngotos, Yshort *);
  edge = NEW2(ngotos + 1, Yshort);
  nedges = 0;

  rowp = F;
  for (i = 0; i < ngotos; i++)
    {
      stateno = to_state[i];
      sp = shift_table[stateno];

      if (sp)
	{
	  k = sp->nshifts;

	  for (j = 0; j < k; j++)
	    {
	      symbol = accessing_symbol[sp->shift[j]];
	      if (ISVAR(symbol))
		break;
	      SETBIT(rowp, symbol);
	    }

	  for (; j < k; j++)
	    {
	      symbol = accessing_symbol[sp->shift[j]];
	      if (nullable[symbol])
		edge[nedges++] = map_goto(stateno, symbol);
	    }
	
	  if (nedges)
	    {
	      reads[i] = rp = NEW2(nedges + 1, Yshort);

	      for (j = 0; j < nedges; j++)
		rp[j] = edge[j];

	      rp[nedges] = -1;
	      nedges = 0;
	    }
	}

      rowp += tokensetsize;
    }

  SETBIT(F, 0);
  digraph(reads);

  for (i = 0; i < ngotos; i++)
    {
      if (reads[i])
	FREE(reads[i]);
    }

  FREE(reads);
  FREE(edge);
}